

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool loadfirstvalue(roaring_uint32_iterator_t *newit)

{
  uint8_t uVar1;
  ulong uVar2;
  long lVar3;
  _Bool _Var4;
  undefined1 uVar5;
  int iVar6;
  uint uVar7;
  
  _Var4 = iter_new_container_partial_init(newit);
  if (_Var4) {
    uVar1 = newit->typecode;
    if ((uVar1 == '\x03') || (uVar1 == '\x02')) {
      newit->current_value = (uint)**(ushort **)((long)newit->container + 8) | newit->highbits;
    }
    else {
      if (uVar1 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x4060,"_Bool loadfirstvalue(roaring_uint32_iterator_t *)");
      }
      uVar7 = 0;
      iVar6 = -0x40;
      do {
        uVar2 = *(ulong *)(*(long *)((long)newit->container + 8) + (ulong)uVar7 * 8);
        uVar7 = uVar7 + 1;
        iVar6 = iVar6 + 0x40;
      } while (uVar2 == 0);
      lVar3 = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      uVar7 = (int)lVar3 + iVar6;
      newit->in_container_index = uVar7;
      newit->current_value = uVar7 | newit->highbits;
    }
    uVar5 = 1;
  }
  else {
    uVar5 = newit->has_value;
  }
  return (_Bool)uVar5;
}

Assistant:

static bool loadfirstvalue(roaring_uint32_iterator_t *newit) {
    if (!iter_new_container_partial_init(newit))
        return newit->has_value;

    switch (newit->typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(newit->container);

            uint32_t wordindex = 0;
            uint64_t word;
            while ((word = bc->words[wordindex]) == 0) {
                wordindex++;  // advance
            }
            // here "word" is non-zero
            newit->in_container_index = wordindex * 64 + __builtin_ctzll(word);
            newit->current_value = newit->highbits | newit->in_container_index;
            break; }

        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(newit->container);
            newit->current_value = newit->highbits | ac->array[0];
            break; }

        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(newit->container);
            newit->current_value = newit->highbits | rc->runs[0].value;
            break; }

        default:
            // if this ever happens, bug!
            assert(false);
    }  // switch (typecode)
    return true;
}